

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

err_t bign96PubkeyVal(bign_params *params,octet *pubkey)

{
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  ec_o *ec;
  word *stack;
  word *a;
  
  bVar1 = memIsValid(params,0x150);
  if (bVar1 == 0) {
    eVar2 = 0x6d;
  }
  else {
    eVar2 = 0x1f6;
    if (params->l == 0x60) {
      sVar3 = bign96Start_keep(bign96PubkeyVal_deep);
      ec = (ec_o *)blobCreate(sVar3);
      if (ec == (ec_o *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        eVar2 = bign96Start(ec,params);
        if (eVar2 == 0) {
          sVar3 = ec->f->n;
          bVar1 = memIsValid(pubkey,0x30);
          if (bVar1 == 0) {
            eVar2 = 0x6d;
          }
          else {
            a = (word *)((long)&(ec->hdr).keep + (ec->hdr).keep);
            stack = a + sVar3 * 2;
            bVar1 = (*ec->f->from)(a,pubkey,ec->f,stack);
            eVar2 = 0x1f9;
            if ((bVar1 != 0) &&
               (bVar1 = (*ec->f->from)(a + sVar3,pubkey + 0x18,ec->f,stack), bVar1 != 0)) {
              bVar1 = ecpIsOnA(a,ec,stack);
              eVar2 = 0x1f9;
              if (bVar1 != 0) {
                eVar2 = 0;
              }
            }
          }
        }
        blobClose(ec);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bign96PubkeyVal(const bign_params* params, const octet pubkey[48])
{
	err_t code;
	size_t n;
	// состояние
	void* state;
	ec_o* ec;			/* описание эллиптической кривой */
	word* Q;			/* [2n] открытый ключ */
	void* stack;
	// проверить params
	if (!memIsValid(params, sizeof(bign_params)))
		return ERR_BAD_INPUT;
	if (params->l != 96)
		return ERR_BAD_PARAMS;
	// создать состояние
	state = blobCreate(bign96Start_keep(bign96PubkeyVal_deep));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// старт
	code = bign96Start(state, params);
	ERR_CALL_HANDLE(code, blobClose(state));
	ec = (ec_o*)state;
	// размерности
	n = ec->f->n;
	// проверить входные указатели
	if (!memIsValid(pubkey, 48))
	{
		blobClose(state);
		return ERR_BAD_INPUT;
	}
	// раскладка состояния
	Q = objEnd(ec, word);
	stack = Q + 2 * n;
	// загрузить pt
	if (!qrFrom(ecX(Q), pubkey, ec->f, stack) ||
		!qrFrom(ecY(Q, n), pubkey + 24, ec->f, stack))
	{
		blobClose(state);
		return ERR_BAD_PUBKEY;
	}
	// Q \in ec?
	code = ecpIsOnA(Q, ec, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}